

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writeincludesbase.cpp
# Opt level: O2

void __thiscall WriteIncludesBase::acceptUI(WriteIncludesBase *this,DomUI *node)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QHash<QString,_QHashDummyValue>::clear(&(this->m_knownClasses).q_hash);
  this->m_laidOut = false;
  if (node->m_includes != (DomIncludes *)0x0) {
    (*(this->super_TreeWalker)._vptr_TreeWalker[0x18])(this);
  }
  if (node->m_customWidgets != (DomCustomWidgets *)0x0) {
    TreeWalker::acceptCustomWidgets(&this->super_TreeWalker,node->m_customWidgets);
  }
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"QApplication";
  local_60.size = 0;
  local_48.size = 0xc;
  add(this,(QString *)&local_48,(DomCustomWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  local_48.d = (Data *)0x0;
  local_60.d = (Data *)0x0;
  local_60.ptr = (char16_t *)0x0;
  local_48.ptr = L"QVariant";
  local_60.size = 0;
  local_48.size = 8;
  add(this,(QString *)&local_48,(DomCustomWidget *)0x0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  if (node->m_buttonGroups != (DomButtonGroups *)0x0) {
    local_48.d = (Data *)0x0;
    local_60.d = (Data *)0x0;
    local_60.ptr = (char16_t *)0x0;
    local_48.ptr = L"QButtonGroup";
    local_60.size = 0;
    local_48.size = 0xc;
    add(this,(QString *)&local_48,(DomCustomWidget *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
  }
  TreeWalker::acceptUI(&this->super_TreeWalker,node);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void WriteIncludesBase::acceptUI(DomUI *node)
{
    m_knownClasses.clear();
    m_laidOut = false;

    if (node->elementIncludes())
        acceptIncludes(node->elementIncludes());

    // Populate known custom widgets first
    if (node->elementCustomWidgets())
        TreeWalker::acceptCustomWidgets(node->elementCustomWidgets());

    add(QStringLiteral("QApplication"));
    add(QStringLiteral("QVariant"));

    if (node->elementButtonGroups())
        add(QStringLiteral("QButtonGroup"));

    TreeWalker::acceptUI(node);
}